

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall
QListModeViewBase::verticalScrollToValue
          (QListModeViewBase *this,int index,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  long lVar1;
  bool bVar2;
  ScrollMode SVar3;
  Promoted<int,_long_long> PVar4;
  byte in_CL;
  int in_EDX;
  QRect *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  int in_stack_0000001c;
  QPersistentModelIndex *idx;
  add_const_t<QSet<QPersistentModelIndex>_> *__range3;
  int numHidden;
  int scrollBarValue;
  int value;
  const_iterator __end3;
  const_iterator __begin3;
  QRect *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff80;
  undefined2 uVar5;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_64;
  int local_50;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 *puVar6;
  undefined1 wrap;
  undefined1 *in_stack_ffffffffffffffe0;
  undefined1 *in_stack_ffffffffffffffe8;
  QListModeViewBase *in_stack_fffffffffffffff0;
  
  wrap = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff80 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = QCommonListViewBase::verticalScrollMode((QCommonListViewBase *)0x881b45);
  if (SVar3 == ScrollPerItem) {
    bVar2 = QList<int>::isEmpty((QList<int> *)0x881b67);
    if (bVar2) {
      local_64 = 0;
    }
    else {
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x881b84);
      QAbstractSlider::value
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffffe8 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffff0 = (QListModeViewBase *)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QPersistentModelIndex>::begin
                ((QSet<QPersistentModelIndex> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      puVar6 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QPersistentModelIndex>::end
                ((QSet<QPersistentModelIndex> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      while( true ) {
        bVar2 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                          ((const_iterator *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (const_iterator *)in_stack_ffffffffffffff48);
        wrap = (undefined1)((ulong)puVar6 >> 0x38);
        if (!bVar2) break;
        QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x881c54);
        QPersistentModelIndex::row();
        QSet<QPersistentModelIndex>::const_iterator::operator++
                  ((const_iterator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x881ca8);
      QAbstractSlider::value
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      QList<int>::at((QList<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (qsizetype)in_stack_ffffffffffffff48);
      QList<int>::size((QList<int> *)&in_RDI[2].x2);
      PVar4 = qBound<int,long_long>
                        ((int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (longlong *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_64 = (int)PVar4;
    }
    if ((in_CL & 1) == 0) {
      local_50 = in_EDX;
      if ((in_R8B & 1) != 0) {
        local_50 = 2;
      }
    }
    else {
      local_50 = 1;
    }
    if (local_50 != 0) {
      QRect::height(in_stack_ffffffffffffff48);
      QCommonListViewBase::isWrapping((QCommonListViewBase *)0x881d6b);
      QRect::height(in_stack_ffffffffffffff48);
      local_64 = perItemScrollToValue
                           (in_stack_fffffffffffffff0,in_stack_0000001c,
                            (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                            (int)in_stack_ffffffffffffffe8,
                            (ScrollHint)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                            (Orientation)in_stack_ffffffffffffffe0,(bool)wrap,(int)idx);
    }
  }
  else {
    local_64 = QCommonListViewBase::verticalScrollToValue
                         ((QCommonListViewBase *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          (ScrollHint)in_stack_ffffffffffffff88,SUB21((ushort)uVar5 >> 8,0),
                          SUB21(uVar5,0),in_RDI,
                          (QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_64;
  }
  __stack_chk_fail();
}

Assistant:

int QListModeViewBase::verticalScrollToValue(int index, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int value;
        if (scrollValueMap.isEmpty()) {
            value = 0;
        } else {
            int scrollBarValue = verticalScrollBar()->value();
            int numHidden = 0;
            for (const auto &idx : std::as_const(dd->hiddenRows))
                if (idx.row() <= scrollBarValue)
                    ++numHidden;
            value = qBound(0, scrollValueMap.at(verticalScrollBar()->value()) - numHidden, flowPositions.size() - 1);
        }
        if (above)
            hint = QListView::PositionAtTop;
        else if (below)
            hint = QListView::PositionAtBottom;
        if (hint == QListView::EnsureVisible)
            return value;

        return perItemScrollToValue(index, value, area.height(), hint, Qt::Vertical, isWrapping(), rect.height());
    }

    return QCommonListViewBase::verticalScrollToValue(index, hint, above, below, area, rect);
}